

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

Am_Value interpolate_1D(Am_Value *value1,Am_Value *value2,float tau)

{
  Am_Value *in_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  Am_Value AVar5;
  float v2;
  float v1;
  float return_val;
  float tau_local;
  Am_Value *value2_local;
  Am_Value *value1_local;
  
  if ((tau != -1.0) || (NAN(tau))) {
    fVar2 = Am_Value::operator_cast_to_float(value2);
    fVar3 = Am_Value::operator_cast_to_float(in_RDX);
    v2 = (fVar3 - fVar2) * tau + fVar2;
  }
  else {
    fVar2 = Am_Value::operator_cast_to_float(value2);
    fVar3 = Am_Value::operator_cast_to_float(in_RDX);
    dVar4 = std::fabs((double)(ulong)(uint)(fVar2 - fVar3));
    v2 = SUB84(dVar4,0);
  }
  if (((value2->type == 2) || (value2->type == 3)) && ((in_RDX->type == 2 || (in_RDX->type == 3))))
  {
    Am_Value::Am_Value(value1,(int)v2);
    aVar1 = extraout_RDX;
  }
  else {
    Am_Value::Am_Value(value1,v2);
    aVar1 = extraout_RDX_00;
  }
  AVar5.value.wrapper_value = aVar1.wrapper_value;
  AVar5._0_8_ = value1;
  return AVar5;
}

Assistant:

static Am_Value
interpolate_1D(const Am_Value &value1, const Am_Value &value2, float tau)
{
  float return_val;

  if (tau == Am_COMPUTE_DISTANCE) {
    // return magnitude of distance between value1 and value2
    return_val = (float)fabs((float)value1 - (float)value2);
  } else {
    float v1 = value1;
    float v2 = value2;

    // return interpolated value
    return_val = v1 + (v2 - v1) * tau;
  }

  if ((value1.type == Am_INT || value1.type == Am_LONG) &&
      (value2.type == Am_INT || value2.type == Am_LONG))
    return (int)return_val;
  else
    return return_val;
}